

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall
ExtraData::parseDECIMAL
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  ostream *poVar1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  local_1c = pos;
  pvStack_18 = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"                DECIMAL:            ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"                 wReserved:         ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](val,(long)local_1c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (val,(long)(local_1c + 1));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST be set to zero and MUST be ignored. ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"                 scale:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (val,(long)(local_1c + 2));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"Order of magnitude of the decimal number. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,
                           "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"The value MUST be in the range of 0 to 28, inclusive. ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"                 sign:              ");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (val,(long)(local_1c + 3));
  if (*pvVar2 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffset_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"The decimal contains a positive value. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (val,(long)(local_1c + 3));
  if (*pvVar2 == 0x80) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffset_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"The decimal contains a negative value. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST equalMUST equal to 0 or 0x80.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"                 Hi32:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,val);
  Utils::print_vec_from_to(&local_38,local_1c + 4,local_1c + 8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST be the high 32 bits of the 96-bit integer ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"that is scaled and signed to represent the final DECIMAL value. "
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"                 Lo64:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,val);
  Utils::print_vec_from_to(&local_60,local_1c + 8,local_1c + 0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"MUST be the low 64 bits of the 96-bit integer");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"that is scaled and signed to represent the final DECIMAL value.")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ExtraData::parseDECIMAL(std::vector<unsigned int> val, int pos) {
    cout << "                DECIMAL:            " << endl;
    cout << "                 wReserved:         " << val[pos] << " " << val[pos+1] <<
         Utils::defaultOffsetDocInfo << "MUST be set to zero and MUST be ignored. " << endl;
    cout << "                 scale:             " << dec << val[pos+2] <<
         Utils::defaultOffsetDocInfo << "Order of magnitude of the decimal number. " << endl <<
         Utils::defaultOffsetDocInfo << "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. " << endl <<
         Utils::defaultOffsetDocInfo << "The value MUST be in the range of 0 to 28, inclusive. " << endl;
    cout << "                 sign:              ";
    if(val[pos+3] == 0)
        cout << Utils::defaultOffset << "The decimal contains a positive value. " << endl;
    if(val[pos+3] == 0x80)
        cout << Utils::defaultOffset << "The decimal contains a negative value. " << endl;
    cout << Utils::defaultOffsetDocInfo << "MUST equalMUST equal to 0 or 0x80." << endl;
    cout << "                 Hi32:              "; Utils::print_vec_from_to(val, pos+4, pos+8);
    cout << Utils::defaultOffsetDocInfo << "MUST be the high 32 bits of the 96-bit integer " << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value. " << endl;
    cout << "                 Lo64:              "; Utils::print_vec_from_to(val, pos+8, pos+16);
    cout << Utils::defaultOffsetDocInfo << "MUST be the low 64 bits of the 96-bit integer" << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value." << endl;
}